

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O1

TResourceType __thiscall
glslang::TDefaultHlslIoResolver::getResourceType(TDefaultHlslIoResolver *this,TType *type)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TResourceType TVar3;
  
  bVar1 = TDefaultIoResolverBase::isUavType(type);
  TVar3 = EResUav;
  if (!bVar1) {
    bVar1 = TDefaultIoResolverBase::isTextureType(type);
    TVar3 = EResTexture;
    if ((!bVar1) &&
       (iVar2 = (*type->_vptr_TType[0xb])(type),
       (*(uint *)(CONCAT44(extraout_var,iVar2) + 8) & 0x7f) != 6)) {
      iVar2 = (*type->_vptr_TType[7])(type);
      if ((iVar2 == 0xe) &&
         (iVar2 = (*type->_vptr_TType[8])(type),
         (*(byte *)(CONCAT44(extraout_var_00,iVar2) + 2) & 0x20) != 0)) {
        return EResSampler;
      }
      iVar2 = (*type->_vptr_TType[0xb])(type);
      TVar3 = (uint)((*(uint *)(CONCAT44(extraout_var_01,iVar2) + 8) & 0x7f) != 5) * 3 + EResUbo;
    }
  }
  return TVar3;
}

Assistant:

TResourceType getResourceType(const glslang::TType& type) override {
        if (isUavType(type)) {
            return EResUav;
        }
        if (isSrvType(type)) {
            return EResTexture;
        }
        if (isSamplerType(type)) {
            return EResSampler;
        }
        if (isUboType(type)) {
            return EResUbo;
        }
        return EResCount;
    }